

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int x9_62_on_exchange(ptls_key_exchange_context_t **_ctx,int release,ptls_iovec_t *secret,
                     ptls_iovec_t peerkey)

{
  st_x9_62_keyex_context_t *ctx;
  EC_KEY *ecdh;
  int iVar1;
  int iVar2;
  EC_GROUP *group;
  EC_POINT *pub_key;
  uint8_t *out;
  size_t __size;
  
  ctx = (st_x9_62_keyex_context_t *)*_ctx;
  group = EC_KEY_get0_group((EC_KEY *)ctx->privkey);
  if (secret == (ptls_iovec_t *)0x0) {
    iVar1 = 0;
    goto LAB_00123e5b;
  }
  pub_key = x9_62_decode_point((EC_GROUP *)group,peerkey,ctx->bn_ctx);
  if (pub_key == (EC_POINT *)0x0) {
    iVar1 = 0x32;
    goto LAB_00123e5b;
  }
  ecdh = (EC_KEY *)ctx->privkey;
  iVar1 = EC_GROUP_get_degree(group);
  __size = (size_t)((iVar1 + 7) / 8);
  out = (uint8_t *)malloc(__size);
  if (out == (uint8_t *)0x0) {
    iVar1 = 0x201;
LAB_00123e3f:
    free(out);
    secret->base = (uint8_t *)0x0;
    secret->len = 0;
  }
  else {
    iVar1 = 0;
    iVar2 = ECDH_compute_key(out,__size,(EC_POINT *)pub_key,ecdh,(KDF *)0x0);
    if (iVar2 < 1) {
      iVar1 = 0x28;
      goto LAB_00123e3f;
    }
    secret->base = out;
    secret->len = __size;
  }
  EC_POINT_free((EC_POINT *)pub_key);
LAB_00123e5b:
  if (release != 0) {
    x9_62_free_context(ctx);
    *_ctx = (ptls_key_exchange_context_t *)0x0;
  }
  return iVar1;
}

Assistant:

static int x9_62_on_exchange(ptls_key_exchange_context_t **_ctx, int release, ptls_iovec_t *secret, ptls_iovec_t peerkey)
{
    struct st_x9_62_keyex_context_t *ctx = (struct st_x9_62_keyex_context_t *)*_ctx;
    const EC_GROUP *group = EC_KEY_get0_group(ctx->privkey);
    EC_POINT *peer_point = NULL;
    int ret;

    if (secret == NULL) {
        ret = 0;
        goto Exit;
    }

    if ((peer_point = x9_62_decode_point(group, peerkey, ctx->bn_ctx)) == NULL) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    if ((ret = ecdh_calc_secret(secret, group, ctx->privkey, peer_point)) != 0)
        goto Exit;

Exit:
    if (peer_point != NULL)
        EC_POINT_free(peer_point);
    if (release) {
        x9_62_free_context(ctx);
        *_ctx = NULL;
    }
    return ret;
}